

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O1

void epoll_dealloc(event_base *base)

{
  undefined8 *ptr;
  
  ptr = (undefined8 *)base->evbase;
  evsig_dealloc_(base);
  if ((void *)*ptr != (void *)0x0) {
    event_mm_free_((void *)*ptr);
  }
  if (-1 < *(int *)((long)ptr + 0xc)) {
    close(*(int *)((long)ptr + 0xc));
  }
  if (-1 < *(int *)(ptr + 2)) {
    close(*(int *)(ptr + 2));
  }
  *ptr = 0;
  ptr[1] = 0;
  ptr[2] = 0;
  event_mm_free_(ptr);
  return;
}

Assistant:

static void
epoll_dealloc(struct event_base *base)
{
	struct epollop *epollop = base->evbase;

	evsig_dealloc_(base);
	if (epollop->events)
		mm_free(epollop->events);
	if (epollop->epfd >= 0)
		close(epollop->epfd);
#ifdef USING_TIMERFD
	if (epollop->timerfd >= 0)
		close(epollop->timerfd);
#endif

	memset(epollop, 0, sizeof(struct epollop));
	mm_free(epollop);
}